

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testIsInfinite<Imath_3_2::Vec2<short>>(char *type)

{
  bool bVar1;
  short sVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  short *psVar6;
  char *in_RDI;
  Box<Imath_3_2::Vec2<short>_> b_1;
  Vec2<short> max;
  Vec2<short> min;
  Box<Imath_3_2::Vec2<short>_> b1;
  int hi;
  int lo;
  uint i;
  Vec2<short> p1;
  Vec2<short> p0;
  Box<Imath_3_2::Vec2<short>_> b0;
  Box<Imath_3_2::Vec2<short>_> b;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  Vec2<short> *in_stack_ffffffffffffffb8;
  Box<Imath_3_2::Vec2<short>_> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  uint local_2c;
  Vec2<short> local_28;
  Vec2<short> local_24;
  Vec2<short> local_20;
  Vec2<short> local_1c [5];
  char *local_8;
  
  local_8 = in_RDI;
  poVar5 = std::operator<<((ostream *)&std::cout,"    isInfinite() for type ");
  poVar5 = std::operator<<(poVar5,local_8);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Box<Imath_3_2::Vec2<short>_>::Box
            ((Box<Imath_3_2::Vec2<short>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  Imath_3_2::Box<Imath_3_2::Vec2<short>_>::makeInfinite
            ((Box<Imath_3_2::Vec2<short>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<short>_>::isInfinite
                    ((Box<Imath_3_2::Vec2<short>_> *)
                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (!bVar1) {
    __assert_fail("b.isInfinite ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x318,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_3_2::Vec2<short>]"
                 );
  }
  Imath_3_2::Vec2<short>::Vec2(local_1c,-1);
  Imath_3_2::Vec2<short>::Vec2(&local_20,1);
  Imath_3_2::Box<Imath_3_2::Vec2<short>_>::Box
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (Vec2<short> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<short>_>::isInfinite
                    ((Box<Imath_3_2::Vec2<short>_> *)
                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b0.isInfinite ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x323,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_3_2::Vec2<short>]"
                 );
  }
  Imath_3_2::Vec2<short>::Vec2(&local_24);
  Imath_3_2::Vec2<short>::Vec2(&local_28);
  local_2c = 0;
  while( true ) {
    uVar4 = local_2c;
    uVar3 = Imath_3_2::Vec2<short>::dimensions();
    if (uVar3 <= uVar4) break;
    uVar4 = Imath_3_2::Vec2<short>::dimensions();
    in_stack_ffffffffffffffcc = 1 << ((char)uVar4 - (char)local_2c & 0x1fU);
    psVar6 = Imath_3_2::Vec2<short>::operator[](&local_24,local_2c);
    *psVar6 = -(short)(1 << ((char)local_2c + 1U & 0x1f));
    sVar2 = (short)in_stack_ffffffffffffffcc;
    psVar6 = Imath_3_2::Vec2<short>::operator[](&local_28,local_2c);
    *psVar6 = sVar2;
    local_2c = local_2c + 1;
  }
  Imath_3_2::Box<Imath_3_2::Vec2<short>_>::Box
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (Vec2<short> *)CONCAT44(in_stack_ffffffffffffffb4,uVar4));
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<short>_>::isInfinite
                    ((Box<Imath_3_2::Vec2<short>_> *)
                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b1.isInfinite ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x32f,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_3_2::Vec2<short>]"
                 );
  }
  Imath_3_2::Vec2<short>::Vec2((Vec2<short> *)&stack0xffffffffffffffc0,0);
  Imath_3_2::Vec2<short>::Vec2
            ((Vec2<short> *)&stack0xffffffffffffffbc,(Vec2<short> *)&stack0xffffffffffffffc0);
  uVar3 = Imath_3_2::Vec2<short>::dimensions();
  psVar6 = Imath_3_2::Vec2<short>::operator[]((Vec2<short> *)&stack0xffffffffffffffbc,uVar3 - 1);
  *psVar6 = 2;
  Imath_3_2::Box<Imath_3_2::Vec2<short>_>::Box
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (Vec2<short> *)CONCAT44(in_stack_ffffffffffffffb4,uVar4));
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<short>_>::isInfinite
                    ((Box<Imath_3_2::Vec2<short>_> *)
                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b.isInfinite ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x340,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_3_2::Vec2<short>]"
                 );
  }
  return;
}

Assistant:

void
testIsInfinite (const char* type)
{
    cout << "    isInfinite() for type " << type << endl;

    //
    // Infinite box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        b.makeInfinite ();
        assert (b.isInfinite ());
    }

    //
    // Non-empty, has-volume box.
    //    2D: [(-2, -4),         ( 8,  2)       ]
    //    3D: [(-2, -4, -6),     (12,  8, 2)    ]
    //    4D: [(-2, -4, -6, -8), (16, 12, 8, 4) ]
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b0 (T (-1), T (1));
        assert (!b0.isInfinite ());

        T p0;
        T p1;
        for (unsigned int i = 0; i < T::dimensions (); i++)
        {
            int lo = 1 << (i + 1);
            int hi = 1 << (T::dimensions () - i);
            p0[i] = -static_cast<typename T::BaseType>(lo);
            p1[i] = static_cast<typename T::BaseType>(hi);
        }
        IMATH_INTERNAL_NAMESPACE::Box<T> b1 (p0, p1);
        assert (!b1.isInfinite ());
    }

    //
    // Non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0),       (0, 2)      ]
    //    3D: [(0, 0, 0),    (0, 0, 2)   ]
    //    4D: [(0, 0, 0, 0), (0, 0, 0, 2)]
    //
    {
        T min (0);
        T max                     = min;
        max[T::dimensions () - 1] = 2;

        IMATH_INTERNAL_NAMESPACE::Box<T> b (min, max);

        assert (!b.isInfinite ());
    }
}